

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O0

void __thiscall
blockfilter_tests::gcsfilter_default_constructor::test_method(gcsfilter_default_constructor *this)

{
  bool bVar1;
  Params *pPVar2;
  long in_FS_OFFSET;
  Params *params;
  GCSFilter filter;
  char *in_stack_fffffffffffffc98;
  lazy_ostream *in_stack_fffffffffffffca0;
  Params *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  Params *in_stack_fffffffffffffcc8;
  GCSFilter *in_stack_fffffffffffffcd0;
  const_string *file;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  lazy_ostream local_274;
  undefined1 local_260 [68];
  lazy_ostream local_21c;
  undefined1 local_208 [68];
  lazy_ostream local_1c4;
  undefined1 local_1b0 [68];
  lazy_ostream local_16c;
  undefined1 local_158 [68];
  lazy_ostream local_114;
  undefined1 local_f8 [64];
  lazy_ostream local_b8;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GCSFilter::Params::Params
            (in_stack_fffffffffffffca8,(uint64_t)in_stack_fffffffffffffca0,
             (uint64_t)in_stack_fffffffffffffc98,'\0',0x476af0);
  GCSFilter::GCSFilter(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
               (const_string *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffca0,(char (*) [1])in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    local_b8._vptr_lazy_ostream._4_4_ = GCSFilter::GetN((GCSFilter *)in_stack_fffffffffffffc98);
    local_b8._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffca8 = (Params *)0x1c66917;
    in_stack_fffffffffffffca0 = &local_b8;
    in_stack_fffffffffffffc98 = "filter.GetN()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_a0,&local_b8.m_empty,0x2f,1,2,
               (undefined1 *)((long)&local_b8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
               (const_string *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffca0,(char (*) [1])in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    GCSFilter::GetEncoded((GCSFilter *)in_stack_fffffffffffffc98);
    local_114._4_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffc98);
    local_114._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffffca8 = (Params *)0x1bc11bb;
    in_stack_fffffffffffffca0 = &local_114;
    in_stack_fffffffffffffc98 = "filter.GetEncoded().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_f8,&local_114.field_0xc,0x30,1,2,
               (undefined1 *)((long)&local_114._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  pPVar2 = GCSFilter::GetParams((GCSFilter *)in_stack_fffffffffffffc98);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
               (const_string *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffca0,(char (*) [1])in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    local_16c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffca8 = (Params *)0x1c66917;
    in_stack_fffffffffffffca0 = &local_16c;
    in_stack_fffffffffffffc98 = "params.m_siphash_k0";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_158,(undefined1 *)((long)&local_16c._vptr_lazy_ostream + 4),0x33,1,2,pPVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
               (const_string *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffca0,(char (*) [1])in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    local_1c4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffca8 = (Params *)0x1c66917;
    in_stack_fffffffffffffca0 = &local_1c4;
    in_stack_fffffffffffffc98 = "params.m_siphash_k1";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1b0,(undefined1 *)((long)&local_1c4._vptr_lazy_ostream + 4),0x34,1,2,
               &pPVar2->m_siphash_k1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
               (const_string *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffca0,(char (*) [1])in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    local_21c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffca8 = (Params *)0x1d1f9c0;
    in_stack_fffffffffffffca0 = &local_21c;
    in_stack_fffffffffffffc98 = "params.m_P";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_208,(undefined1 *)((long)&local_21c._vptr_lazy_ostream + 4),0x35,1,2,
               &pPVar2->m_P);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc98);
    in_stack_fffffffffffffcdf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcdf);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),file
               ,(size_t)in_stack_fffffffffffffcc8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
    in_stack_fffffffffffffcc8 = (Params *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffca0,(char (*) [1])in_stack_fffffffffffffc98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffca8,
               (pointer)in_stack_fffffffffffffca0,(unsigned_long)in_stack_fffffffffffffc98);
    local_274._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffffca8 = (Params *)0x1bc11bb;
    in_stack_fffffffffffffca0 = &local_274;
    in_stack_fffffffffffffc98 = "params.m_M";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_260,(undefined1 *)((long)&local_274._vptr_lazy_ostream + 4),0x36,1,2,
               &pPVar2->m_M);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc98);
    in_stack_fffffffffffffcc7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcc7);
  GCSFilter::~GCSFilter((GCSFilter *)in_stack_fffffffffffffc98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(gcsfilter_default_constructor)
{
    GCSFilter filter;
    BOOST_CHECK_EQUAL(filter.GetN(), 0U);
    BOOST_CHECK_EQUAL(filter.GetEncoded().size(), 1U);

    const GCSFilter::Params& params = filter.GetParams();
    BOOST_CHECK_EQUAL(params.m_siphash_k0, 0U);
    BOOST_CHECK_EQUAL(params.m_siphash_k1, 0U);
    BOOST_CHECK_EQUAL(params.m_P, 0);
    BOOST_CHECK_EQUAL(params.m_M, 1U);
}